

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestraintStamp.cpp
# Opt level: O2

void __thiscall OpenMD::RestraintStamp::RestraintStamp(RestraintStamp *this)

{
  ParamMap *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  allocator<char> local_d1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  local_b0;
  ParameterBase *local_88;
  ParameterBase *local_80;
  ParameterBase *local_78;
  ParameterBase *local_70;
  ParameterBase *local_68;
  ParameterBase *local_60;
  ParameterBase *local_58;
  ParameterBase *local_50;
  ParameterBase *local_48;
  ParameterBase *local_40;
  ParameterBase *local_38;
  
  DataHolder::DataHolder(&this->super_DataHolder);
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__RestraintStamp_002bf7f0;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter(&this->Type);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter(&this->ObjectSelection);
  (this->MolIndex).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->MolIndex).super_ParameterBase.keyword_.field_2;
  (this->MolIndex).super_ParameterBase.keyword_._M_string_length = 0;
  (this->MolIndex).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->MolIndex).super_ParameterBase.optional_ = false;
  (this->MolIndex).super_ParameterBase.defaultValue_ = false;
  local_38 = &(this->MolIndex).super_ParameterBase;
  (this->MolIndex).super_ParameterBase.empty_ = true;
  (this->MolIndex).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bccd0;
  local_40 = &(this->DisplacementSpringConstant).super_ParameterBase;
  (this->DisplacementSpringConstant).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->DisplacementSpringConstant).super_ParameterBase.keyword_.field_2;
  (this->DisplacementSpringConstant).super_ParameterBase.keyword_._M_string_length = 0;
  (this->DisplacementSpringConstant).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->DisplacementSpringConstant).super_ParameterBase.optional_ = false;
  (this->DisplacementSpringConstant).super_ParameterBase.defaultValue_ = false;
  (this->DisplacementSpringConstant).super_ParameterBase.empty_ = true;
  (this->DisplacementSpringConstant).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bcc58;
  (this->AbsoluteSpringConstant).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->AbsoluteSpringConstant).super_ParameterBase.keyword_.field_2;
  (this->AbsoluteSpringConstant).super_ParameterBase.keyword_._M_string_length = 0;
  (this->AbsoluteSpringConstant).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->AbsoluteSpringConstant).super_ParameterBase.optional_ = false;
  (this->AbsoluteSpringConstant).super_ParameterBase.defaultValue_ = false;
  local_48 = &(this->AbsoluteSpringConstant).super_ParameterBase;
  (this->AbsoluteSpringConstant).super_ParameterBase.empty_ = true;
  (this->AbsoluteSpringConstant).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bcc58;
  (this->TwistSpringConstant).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->TwistSpringConstant).super_ParameterBase.keyword_.field_2;
  (this->TwistSpringConstant).super_ParameterBase.keyword_._M_string_length = 0;
  (this->TwistSpringConstant).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->TwistSpringConstant).super_ParameterBase.optional_ = false;
  (this->TwistSpringConstant).super_ParameterBase.defaultValue_ = false;
  local_50 = &(this->TwistSpringConstant).super_ParameterBase;
  (this->TwistSpringConstant).super_ParameterBase.empty_ = true;
  (this->TwistSpringConstant).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bcc58;
  (this->SwingXSpringConstant).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->SwingXSpringConstant).super_ParameterBase.keyword_.field_2;
  (this->SwingXSpringConstant).super_ParameterBase.keyword_._M_string_length = 0;
  (this->SwingXSpringConstant).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->SwingXSpringConstant).super_ParameterBase.optional_ = false;
  (this->SwingXSpringConstant).super_ParameterBase.defaultValue_ = false;
  local_58 = &(this->SwingXSpringConstant).super_ParameterBase;
  (this->SwingXSpringConstant).super_ParameterBase.empty_ = true;
  (this->SwingXSpringConstant).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bcc58;
  (this->SwingYSpringConstant).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->SwingYSpringConstant).super_ParameterBase.keyword_.field_2;
  (this->SwingYSpringConstant).super_ParameterBase.keyword_._M_string_length = 0;
  (this->SwingYSpringConstant).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->SwingYSpringConstant).super_ParameterBase.optional_ = false;
  (this->SwingYSpringConstant).super_ParameterBase.defaultValue_ = false;
  local_60 = &(this->SwingYSpringConstant).super_ParameterBase;
  (this->SwingYSpringConstant).super_ParameterBase.empty_ = true;
  (this->SwingYSpringConstant).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bcc58;
  (this->AbsolutePositionZ).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->AbsolutePositionZ).super_ParameterBase.keyword_.field_2;
  (this->AbsolutePositionZ).super_ParameterBase.keyword_._M_string_length = 0;
  (this->AbsolutePositionZ).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->AbsolutePositionZ).super_ParameterBase.optional_ = false;
  (this->AbsolutePositionZ).super_ParameterBase.defaultValue_ = false;
  local_68 = &(this->AbsolutePositionZ).super_ParameterBase;
  (this->AbsolutePositionZ).super_ParameterBase.empty_ = true;
  (this->AbsolutePositionZ).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bcc58;
  (this->RestrainedTwistAngle).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->RestrainedTwistAngle).super_ParameterBase.keyword_.field_2;
  (this->RestrainedTwistAngle).super_ParameterBase.keyword_._M_string_length = 0;
  (this->RestrainedTwistAngle).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->RestrainedTwistAngle).super_ParameterBase.optional_ = false;
  (this->RestrainedTwistAngle).super_ParameterBase.defaultValue_ = false;
  local_70 = &(this->RestrainedTwistAngle).super_ParameterBase;
  (this->RestrainedTwistAngle).super_ParameterBase.empty_ = true;
  (this->RestrainedTwistAngle).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bcc58;
  (this->RestrainedSwingXAngle).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->RestrainedSwingXAngle).super_ParameterBase.keyword_.field_2;
  (this->RestrainedSwingXAngle).super_ParameterBase.keyword_._M_string_length = 0;
  (this->RestrainedSwingXAngle).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->RestrainedSwingXAngle).super_ParameterBase.optional_ = false;
  (this->RestrainedSwingXAngle).super_ParameterBase.defaultValue_ = false;
  local_78 = &(this->RestrainedSwingXAngle).super_ParameterBase;
  (this->RestrainedSwingXAngle).super_ParameterBase.empty_ = true;
  (this->RestrainedSwingXAngle).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bcc58;
  (this->RestrainedSwingYAngle).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->RestrainedSwingYAngle).super_ParameterBase.keyword_.field_2;
  (this->RestrainedSwingYAngle).super_ParameterBase.keyword_._M_string_length = 0;
  (this->RestrainedSwingYAngle).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->RestrainedSwingYAngle).super_ParameterBase.optional_ = false;
  (this->RestrainedSwingYAngle).super_ParameterBase.defaultValue_ = false;
  local_80 = &(this->RestrainedSwingYAngle).super_ParameterBase;
  (this->RestrainedSwingYAngle).super_ParameterBase.empty_ = true;
  (this->RestrainedSwingYAngle).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bcc58;
  (this->Print).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->Print).super_ParameterBase.keyword_.field_2;
  (this->Print).super_ParameterBase.keyword_._M_string_length = 0;
  (this->Print).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Print).super_ParameterBase.optional_ = false;
  (this->Print).super_ParameterBase.defaultValue_ = false;
  local_88 = &(this->Print).super_ParameterBase;
  (this->Print).super_ParameterBase.empty_ = true;
  (this->Print).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__ParameterBase_002bcbe0
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"restraintType",(allocator<char> *)&local_d0);
  std::__cxx11::string::_M_assign((string *)&(this->Type).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"restraintType",&local_d1);
  local_b0.first._M_string_length = local_c8;
  this_00 = &(this->super_DataHolder).parameters_;
  paVar1 = &local_b0.first.field_2;
  if (local_d0 == &local_c0) {
    local_b0.first.field_2._8_8_ = local_c0._8_8_;
    local_b0.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b0.first._M_dataplus._M_p = (pointer)local_d0;
  }
  local_c8 = 0;
  local_c0._M_local_buf[0] = '\0';
  local_d0 = &local_c0;
  local_b0.second = &(this->Type).super_ParameterBase;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"molIndex",(allocator<char> *)&local_d0);
  std::__cxx11::string::_M_assign((string *)&(this->MolIndex).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_b0);
  (this->MolIndex).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"molIndex",&local_d1);
  local_b0.first._M_string_length = local_c8;
  if (local_d0 == &local_c0) {
    local_b0.first.field_2._8_8_ = local_c0._8_8_;
    local_b0.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b0.first._M_dataplus._M_p = (pointer)local_d0;
  }
  local_b0.first.field_2._M_allocated_capacity._1_7_ = local_c0._M_allocated_capacity._1_7_;
  local_b0.first.field_2._M_local_buf[0] = local_c0._M_local_buf[0];
  local_c8 = 0;
  local_c0._M_local_buf[0] = '\0';
  local_b0.second = local_38;
  local_d0 = &local_c0;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"objectSelection",(allocator<char> *)&local_d0);
  std::__cxx11::string::_M_assign((string *)&(this->ObjectSelection).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_b0);
  (this->ObjectSelection).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"objectSelection",&local_d1);
  local_b0.first._M_string_length = local_c8;
  if (local_d0 == &local_c0) {
    local_b0.first.field_2._8_8_ = local_c0._8_8_;
    local_b0.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b0.first._M_dataplus._M_p = (pointer)local_d0;
  }
  local_b0.first.field_2._M_allocated_capacity._1_7_ = local_c0._M_allocated_capacity._1_7_;
  local_b0.first.field_2._M_local_buf[0] = local_c0._M_local_buf[0];
  local_c8 = 0;
  local_c0._M_local_buf[0] = '\0';
  local_d0 = &local_c0;
  local_b0.second = &(this->ObjectSelection).super_ParameterBase;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"displacementSpringConstant",(allocator<char> *)&local_d0);
  std::__cxx11::string::_M_assign
            ((string *)&(this->DisplacementSpringConstant).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_b0);
  (this->DisplacementSpringConstant).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"displacementSpringConstant",&local_d1);
  local_b0.first._M_string_length = local_c8;
  if (local_d0 == &local_c0) {
    local_b0.first.field_2._8_8_ = local_c0._8_8_;
    local_b0.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b0.first._M_dataplus._M_p = (pointer)local_d0;
  }
  local_b0.first.field_2._M_allocated_capacity._1_7_ = local_c0._M_allocated_capacity._1_7_;
  local_b0.first.field_2._M_local_buf[0] = local_c0._M_local_buf[0];
  local_c8 = 0;
  local_c0._M_local_buf[0] = '\0';
  local_b0.second = local_40;
  local_d0 = &local_c0;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"absoluteSpringConstant",(allocator<char> *)&local_d0);
  std::__cxx11::string::_M_assign
            ((string *)&(this->AbsoluteSpringConstant).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_b0);
  (this->AbsoluteSpringConstant).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"absoluteSpringConstant",&local_d1);
  local_b0.first._M_string_length = local_c8;
  if (local_d0 == &local_c0) {
    local_b0.first.field_2._8_8_ = local_c0._8_8_;
    local_b0.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b0.first._M_dataplus._M_p = (pointer)local_d0;
  }
  local_b0.first.field_2._M_allocated_capacity._1_7_ = local_c0._M_allocated_capacity._1_7_;
  local_b0.first.field_2._M_local_buf[0] = local_c0._M_local_buf[0];
  local_c8 = 0;
  local_c0._M_local_buf[0] = '\0';
  local_b0.second = local_48;
  local_d0 = &local_c0;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"twistSpringConstant",(allocator<char> *)&local_d0);
  std::__cxx11::string::_M_assign
            ((string *)&(this->TwistSpringConstant).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_b0);
  (this->TwistSpringConstant).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"twistSpringConstant",&local_d1);
  local_b0.first._M_string_length = local_c8;
  if (local_d0 == &local_c0) {
    local_b0.first.field_2._8_8_ = local_c0._8_8_;
    local_b0.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b0.first._M_dataplus._M_p = (pointer)local_d0;
  }
  local_b0.first.field_2._M_allocated_capacity._1_7_ = local_c0._M_allocated_capacity._1_7_;
  local_b0.first.field_2._M_local_buf[0] = local_c0._M_local_buf[0];
  local_c8 = 0;
  local_c0._M_local_buf[0] = '\0';
  local_b0.second = local_50;
  local_d0 = &local_c0;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"swingXSpringConstant",(allocator<char> *)&local_d0);
  std::__cxx11::string::_M_assign
            ((string *)&(this->SwingXSpringConstant).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_b0);
  (this->SwingXSpringConstant).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"swingXSpringConstant",&local_d1);
  local_b0.first._M_string_length = local_c8;
  if (local_d0 == &local_c0) {
    local_b0.first.field_2._8_8_ = local_c0._8_8_;
    local_b0.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b0.first._M_dataplus._M_p = (pointer)local_d0;
  }
  local_b0.first.field_2._M_allocated_capacity._1_7_ = local_c0._M_allocated_capacity._1_7_;
  local_b0.first.field_2._M_local_buf[0] = local_c0._M_local_buf[0];
  local_c8 = 0;
  local_c0._M_local_buf[0] = '\0';
  local_b0.second = local_58;
  local_d0 = &local_c0;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"swingYSpringConstant",(allocator<char> *)&local_d0);
  std::__cxx11::string::_M_assign
            ((string *)&(this->SwingYSpringConstant).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_b0);
  (this->SwingYSpringConstant).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"swingYSpringConstant",&local_d1);
  local_b0.first._M_string_length = local_c8;
  if (local_d0 == &local_c0) {
    local_b0.first.field_2._8_8_ = local_c0._8_8_;
    local_b0.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b0.first._M_dataplus._M_p = (pointer)local_d0;
  }
  local_b0.first.field_2._M_allocated_capacity._1_7_ = local_c0._M_allocated_capacity._1_7_;
  local_b0.first.field_2._M_local_buf[0] = local_c0._M_local_buf[0];
  local_c8 = 0;
  local_c0._M_local_buf[0] = '\0';
  local_b0.second = local_60;
  local_d0 = &local_c0;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"absolutePositionZ",(allocator<char> *)&local_d0);
  std::__cxx11::string::_M_assign((string *)&(this->AbsolutePositionZ).super_ParameterBase.keyword_)
  ;
  std::__cxx11::string::~string((string *)&local_b0);
  (this->AbsolutePositionZ).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"absolutePositionZ",&local_d1);
  local_b0.first._M_string_length = local_c8;
  if (local_d0 == &local_c0) {
    local_b0.first.field_2._8_8_ = local_c0._8_8_;
    local_b0.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b0.first._M_dataplus._M_p = (pointer)local_d0;
  }
  local_b0.first.field_2._M_allocated_capacity._1_7_ = local_c0._M_allocated_capacity._1_7_;
  local_b0.first.field_2._M_local_buf[0] = local_c0._M_local_buf[0];
  local_c8 = 0;
  local_c0._M_local_buf[0] = '\0';
  local_b0.second = local_68;
  local_d0 = &local_c0;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"restrainedTwistAngle",(allocator<char> *)&local_d0);
  std::__cxx11::string::_M_assign
            ((string *)&(this->RestrainedTwistAngle).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_b0);
  (this->RestrainedTwistAngle).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"restrainedTwistAngle",&local_d1);
  local_b0.first._M_string_length = local_c8;
  if (local_d0 == &local_c0) {
    local_b0.first.field_2._8_8_ = local_c0._8_8_;
    local_b0.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b0.first._M_dataplus._M_p = (pointer)local_d0;
  }
  local_b0.first.field_2._M_allocated_capacity._1_7_ = local_c0._M_allocated_capacity._1_7_;
  local_b0.first.field_2._M_local_buf[0] = local_c0._M_local_buf[0];
  local_c8 = 0;
  local_c0._M_local_buf[0] = '\0';
  local_b0.second = local_70;
  local_d0 = &local_c0;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"restrainedSwingXAngle",(allocator<char> *)&local_d0);
  std::__cxx11::string::_M_assign
            ((string *)&(this->RestrainedSwingXAngle).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_b0);
  (this->RestrainedSwingXAngle).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"restrainedSwingXAngle",&local_d1);
  local_b0.first._M_string_length = local_c8;
  if (local_d0 == &local_c0) {
    local_b0.first.field_2._8_8_ = local_c0._8_8_;
    local_b0.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b0.first._M_dataplus._M_p = (pointer)local_d0;
  }
  local_b0.first.field_2._M_allocated_capacity._1_7_ = local_c0._M_allocated_capacity._1_7_;
  local_b0.first.field_2._M_local_buf[0] = local_c0._M_local_buf[0];
  local_c8 = 0;
  local_c0._M_local_buf[0] = '\0';
  local_b0.second = local_78;
  local_d0 = &local_c0;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"restrainedSwingYAngle",(allocator<char> *)&local_d0);
  std::__cxx11::string::_M_assign
            ((string *)&(this->RestrainedSwingYAngle).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_b0);
  (this->RestrainedSwingYAngle).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"restrainedSwingYAngle",&local_d1);
  local_b0.first._M_string_length = local_c8;
  if (local_d0 == &local_c0) {
    local_b0.first.field_2._8_8_ = local_c0._8_8_;
    local_b0.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b0.first._M_dataplus._M_p = (pointer)local_d0;
  }
  local_b0.first.field_2._M_allocated_capacity._1_7_ = local_c0._M_allocated_capacity._1_7_;
  local_b0.first.field_2._M_local_buf[0] = local_c0._M_local_buf[0];
  local_c8 = 0;
  local_c0._M_local_buf[0] = '\0';
  local_b0.second = local_80;
  local_d0 = &local_c0;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"print",(allocator<char> *)&local_d0);
  std::__cxx11::string::_M_assign((string *)&(this->Print).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_b0);
  (this->Print).super_ParameterBase.optional_ = true;
  (this->Print).super_ParameterBase.defaultValue_ = true;
  (this->Print).super_ParameterBase.empty_ = false;
  (this->Print).super_ParameterBase.field_0x2b = 1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"print",&local_d1);
  local_b0.first._M_string_length = local_c8;
  if (local_d0 == &local_c0) {
    local_b0.first.field_2._8_8_ = local_c0._8_8_;
    local_b0.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b0.first._M_dataplus._M_p = (pointer)local_d0;
  }
  local_b0.first.field_2._M_allocated_capacity._1_7_ = local_c0._M_allocated_capacity._1_7_;
  local_b0.first.field_2._M_local_buf[0] = local_c0._M_local_buf[0];
  local_c8 = 0;
  local_c0._M_local_buf[0] = '\0';
  local_b0.second = local_88;
  local_d0 = &local_c0;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  return;
}

Assistant:

RestraintStamp::RestraintStamp() {
    DefineParameter(Type, "restraintType");

    DefineOptionalParameter(MolIndex, "molIndex");
    DefineOptionalParameter(ObjectSelection, "objectSelection");
    DefineOptionalParameter(DisplacementSpringConstant,
                            "displacementSpringConstant");
    DefineOptionalParameter(AbsoluteSpringConstant, "absoluteSpringConstant");
    DefineOptionalParameter(TwistSpringConstant, "twistSpringConstant");
    DefineOptionalParameter(SwingXSpringConstant, "swingXSpringConstant");
    DefineOptionalParameter(SwingYSpringConstant, "swingYSpringConstant");

    DefineOptionalParameter(AbsolutePositionZ, "absolutePositionZ");
    DefineOptionalParameter(RestrainedTwistAngle, "restrainedTwistAngle");
    DefineOptionalParameter(RestrainedSwingXAngle, "restrainedSwingXAngle");
    DefineOptionalParameter(RestrainedSwingYAngle, "restrainedSwingYAngle");
    DefineOptionalParameterWithDefaultValue(Print, "print", true);
  }